

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O3

void operations_test<viennamath::ct_constant<7l>>(ct_constant<7L> *t)

{
  ct_constant<7L> c7;
  ct_constant<5L> c5;
  ct_variable<0UL> x;
  ct_constant<7L> local_13;
  ct_constant<5L> local_12;
  ct_variable<0UL> local_11;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  local_10;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  local_e;
  ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  local_c;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  local_a;
  
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_variable<0ul>>(t,&local_11,7.0,4.0);
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_constant<5l>>(t,&local_12,7.0,5.0);
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_constant<7l>>(t,&local_13,7.0,7.0);
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>
            (t,&local_a,7.0,10.0);
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
            (t,&local_c,7.0,48.0);
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            (t,&local_e,7.0,1.25);
  operations_test<viennamath::ct_constant<7l>,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>
            (t,&local_10,7.0,-1.0);
  return;
}

Assistant:

void operations_test(T const & t)
{
  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;

  operations_test(t, x);
  operations_test(t, c5);
  operations_test(t, c7);
  operations_test(t, x + y);
  operations_test(t, z * y);
  operations_test(t, c5 / x);
  operations_test(t, c7 - z);
}